

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

void xmlRelaxNGFreeStates(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGStatesPtr states)

{
  int iVar1;
  xmlRelaxNGStatesPtr *ppxVar2;
  xmlRelaxNGStatesPtr *tmp;
  xmlRelaxNGStatesPtr states_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  if (states != (xmlRelaxNGStatesPtr)0x0) {
    if ((ctxt == (xmlRelaxNGValidCtxtPtr)0x0) || (ctxt->freeStates != (xmlRelaxNGStatesPtr *)0x0)) {
      if ((ctxt != (xmlRelaxNGValidCtxtPtr)0x0) && (ctxt->freeStatesMax <= ctxt->freeStatesNr)) {
        ppxVar2 = (xmlRelaxNGStatesPtr *)
                  (*xmlRealloc)(ctxt->freeStates,(long)(ctxt->freeStatesMax << 1) << 3);
        if (ppxVar2 == (xmlRelaxNGStatesPtr *)0x0) {
          xmlRngVErrMemory(ctxt,"storing states\n");
          (*xmlFree)(states->tabState);
          (*xmlFree)(states);
          return;
        }
        ctxt->freeStates = ppxVar2;
        ctxt->freeStatesMax = ctxt->freeStatesMax << 1;
      }
    }
    else {
      ctxt->freeStatesMax = 0x28;
      ctxt->freeStatesNr = 0;
      ppxVar2 = (xmlRelaxNGStatesPtr *)(*xmlMalloc)((long)ctxt->freeStatesMax << 3);
      ctxt->freeStates = ppxVar2;
      if (ctxt->freeStates == (xmlRelaxNGStatesPtr *)0x0) {
        xmlRngVErrMemory(ctxt,"storing states\n");
      }
    }
    if ((ctxt == (xmlRelaxNGValidCtxtPtr)0x0) || (ctxt->freeStates == (xmlRelaxNGStatesPtr *)0x0)) {
      (*xmlFree)(states->tabState);
      (*xmlFree)(states);
    }
    else {
      iVar1 = ctxt->freeStatesNr;
      ctxt->freeStatesNr = iVar1 + 1;
      ctxt->freeStates[iVar1] = states;
    }
  }
  return;
}

Assistant:

static void
xmlRelaxNGFreeStates(xmlRelaxNGValidCtxtPtr ctxt,
                     xmlRelaxNGStatesPtr states)
{
    if (states == NULL)
        return;
    if ((ctxt != NULL) && (ctxt->freeStates == NULL)) {
        ctxt->freeStatesMax = 40;
        ctxt->freeStatesNr = 0;
        ctxt->freeStates = (xmlRelaxNGStatesPtr *)
            xmlMalloc(ctxt->freeStatesMax * sizeof(xmlRelaxNGStatesPtr));
        if (ctxt->freeStates == NULL) {
            xmlRngVErrMemory(ctxt, "storing states\n");
        }
    } else if ((ctxt != NULL)
               && (ctxt->freeStatesNr >= ctxt->freeStatesMax)) {
        xmlRelaxNGStatesPtr *tmp;

        tmp = (xmlRelaxNGStatesPtr *) xmlRealloc(ctxt->freeStates,
                                                 2 * ctxt->freeStatesMax *
                                                 sizeof
                                                 (xmlRelaxNGStatesPtr));
        if (tmp == NULL) {
            xmlRngVErrMemory(ctxt, "storing states\n");
            xmlFree(states->tabState);
            xmlFree(states);
            return;
        }
        ctxt->freeStates = tmp;
        ctxt->freeStatesMax *= 2;
    }
    if ((ctxt == NULL) || (ctxt->freeStates == NULL)) {
        xmlFree(states->tabState);
        xmlFree(states);
    } else {
        ctxt->freeStates[ctxt->freeStatesNr++] = states;
    }
}